

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

type * __thiscall
njoy::ENDFtk::Material::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (type *__return_storage_ptr__,Material *this,StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  int args_1;
  bool bVar1;
  undefined8 *puVar2;
  StructureDivision SStack_88;
  vector<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  files;
  
  files.
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (bVar1 = StructureDivision::isMend((StructureDivision *)this), !bVar1) {
    args_1 = *(int *)((long)&(this->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
    switch(args_1) {
    case 1:
      ENDFtk::file::
      Base<njoy::ENDFtk::file::Type<1>,std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
      ::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<1>,std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
                  *)&SStack_88,(StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<1>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<1> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>_>_>_>
                   *)&SStack_88);
      break;
    case 2:
      ENDFtk::file::
      Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
      ::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
                  *)&SStack_88,(StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<2>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<2> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
                   *)&SStack_88);
      break;
    case 3:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::section::Type<3>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::section::Type<3>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<3>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<3> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
                   *)&SStack_88);
      break;
    case 4:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::section::Type<4>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::section::Type<4>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<4>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<4> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<4>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<4>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<4>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<4>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<4>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<4>_>_>_>
                   *)&SStack_88);
      break;
    case 5:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::section::Type<5>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::section::Type<5>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<5>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<5> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<5>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<5>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<5>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<5>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<5>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<5>_>_>_>
                   *)&SStack_88);
      break;
    case 6:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::section::Type<6>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::section::Type<6>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<6>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<6> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<6>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<6>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<6>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<6>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<6>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<6>_>_>_>
                   *)&SStack_88);
      break;
    case 7:
      ENDFtk::file::
      Base<njoy::ENDFtk::file::Type<7>,std::variant<njoy::ENDFtk::section::Type<7,2>,njoy::ENDFtk::section::Type<7,4>,njoy::ENDFtk::section::Type<7,451>>>
      ::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<7>,std::variant<njoy::ENDFtk::section::Type<7,2>,njoy::ENDFtk::section::Type<7,4>,njoy::ENDFtk::section::Type<7,451>>>
                  *)&SStack_88,(StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<7>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<7> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<7,_2>,_njoy::ENDFtk::section::Type<7,_4>,_njoy::ENDFtk::section::Type<7,_451>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<7,_2>,_njoy::ENDFtk::section::Type<7,_4>,_njoy::ENDFtk::section::Type<7,_451>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<7,_2>,_njoy::ENDFtk::section::Type<7,_4>,_njoy::ENDFtk::section::Type<7,_451>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<7,_2>,_njoy::ENDFtk::section::Type<7,_4>,_njoy::ENDFtk::section::Type<7,_451>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<7,_2>,_njoy::ENDFtk::section::Type<7,_4>,_njoy::ENDFtk::section::Type<7,_451>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<7,_2>,_njoy::ENDFtk::section::Type<7,_4>,_njoy::ENDFtk::section::Type<7,_451>_>_>_>_>
                   *)&SStack_88);
      break;
    case 8:
      ENDFtk::file::Type<8>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Type<8> *)&SStack_88,(StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<8>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<8> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                   *)&SStack_88);
      break;
    case 9:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::section::Type<9>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::section::Type<9>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<9>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<9> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>_>_>
                   *)&SStack_88);
      break;
    case 10:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::section::Type<10>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::section::Type<10>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<10>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<10> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<10>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<10>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<10>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<10>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<10>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<10>_>_>_>
                   *)&SStack_88);
      break;
    default:
      tools::Log::error<char_const*,int>("Found unsupported file MF{} - skipping file",args_1);
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = getenv;
      __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
    case 0xc:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::section::Type<12>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::section::Type<12>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<12>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<12> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<12>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<12>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<12>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<12>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<12>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<12>_>_>_>
                   *)&SStack_88);
      break;
    case 0xd:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::section::Type<13>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::section::Type<13>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<13>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<13> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<13>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<13>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<13>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<13>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<13>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<13>_>_>_>
                   *)&SStack_88);
      break;
    case 0xe:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::section::Type<14>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::section::Type<14>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<14>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<14> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>_>_>
                   *)&SStack_88);
      break;
    case 0xf:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::section::Type<15>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::section::Type<15>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<15>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<15> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<15>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<15>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<15>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<15>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<15>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<15>_>_>_>
                   *)&SStack_88);
      break;
    case 0x17:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::section::Type<23>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::section::Type<23>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<23>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<23> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>_>_>
                   *)&SStack_88);
      break;
    case 0x1a:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::section::Type<26>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::section::Type<26>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<26>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<26> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<26>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<26>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<26>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<26>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<26>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<26>_>_>_>
                   *)&SStack_88);
      break;
    case 0x1b:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::section::Type<27>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::section::Type<27>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<27>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<27> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<27>_>_>_>
                   *)&SStack_88);
      break;
    case 0x1c:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::section::Type<28>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::section::Type<28>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<28>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<28> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>_>
                   *)&SStack_88);
      break;
    case 0x1e:
      ENDFtk::file::NotImplementedYet<njoy::ENDFtk::file::Type<30>>::
      NotImplementedYet<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((NotImplementedYet<njoy::ENDFtk::file::Type<30>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<30>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<30> *)&SStack_88);
      break;
    case 0x1f:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::section::Type<31>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::section::Type<31>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<31>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<31> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<31>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<31>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<31>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<31>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<31>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<31>_>_>_>
                   *)&SStack_88);
      break;
    case 0x20:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::section::Type<32,151>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::section::Type<32,151>> *)
                 &SStack_88,(StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<32>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<32> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<32,_151>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<32,_151>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<32,_151>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<32,_151>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<32,_151>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<32,_151>_>_>_>
                   *)&SStack_88);
      break;
    case 0x21:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::section::Type<33>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::section::Type<33>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<33>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<33> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<33>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<33>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<33>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<33>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<33>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<33>_>_>_>
                   *)&SStack_88);
      break;
    case 0x22:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::section::Type<34>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::section::Type<34>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<34>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<34> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>_>_>
                   *)&SStack_88);
      break;
    case 0x23:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::section::Type<35>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::section::Type<35>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<35>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<35> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<35>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<35>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<35>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<35>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<35>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<35>_>_>_>
                   *)&SStack_88);
      break;
    case 0x28:
      ENDFtk::file::Base<njoy::ENDFtk::file::Type<40>,njoy::ENDFtk::section::Type<40>>::
      Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Base<njoy::ENDFtk::file::Type<40>,njoy::ENDFtk::section::Type<40>> *)&SStack_88,
                 (StructureDivision *)this,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)division,begin,(long *)end);
      std::
      vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
      ::emplace_back<njoy::ENDFtk::file::Type<40>>
                ((vector<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>,std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,njoy::ENDFtk::file::Type<2>,njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::file::Type<4>,njoy::ENDFtk::file::Type<5>,njoy::ENDFtk::file::Type<6>,njoy::ENDFtk::file::Type<7>,njoy::ENDFtk::file::Type<8>,njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::file::Type<10>,njoy::ENDFtk::file::Type<12>,njoy::ENDFtk::file::Type<13>,njoy::ENDFtk::file::Type<14>,njoy::ENDFtk::file::Type<15>,njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::file::Type<27>,njoy::ENDFtk::file::Type<28>,njoy::ENDFtk::file::Type<30>,njoy::ENDFtk::file::Type<31>,njoy::ENDFtk::file::Type<32>,njoy::ENDFtk::file::Type<33>,njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::file::Type<35>,njoy::ENDFtk::file::Type<40>>>>
                  *)&files,(Type<40> *)&SStack_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<40>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<40>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<40>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<40>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<40>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<40>_>_>_>
                   *)&SStack_88);
    }
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&SStack_88,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end);
    StructureDivision::operator=((StructureDivision *)this,&SStack_88);
  }
  verifyMEND((StructureDivision *)this,(long)end->_M_current);
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       files.
       super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       files.
       super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       files.
       super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  files.
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>,_std::allocator<std::variant<njoy::ENDFtk::file::Type<1>,_njoy::ENDFtk::file::Type<2>,_njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::file::Type<4>,_njoy::ENDFtk::file::Type<5>,_njoy::ENDFtk::file::Type<6>,_njoy::ENDFtk::file::Type<7>,_njoy::ENDFtk::file::Type<8>,_njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::file::Type<10>,_njoy::ENDFtk::file::Type<12>,_njoy::ENDFtk::file::Type<13>,_njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::file::Type<15>,_njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::file::Type<26>,_njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::file::Type<30>,_njoy::ENDFtk::file::Type<31>,_njoy::ENDFtk::file::Type<32>,_njoy::ENDFtk::file::Type<33>,_njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::file::Type<35>,_njoy::ENDFtk::file::Type<40>_>_>_>
  ::~vector(&files);
  return __return_storage_ptr__;
}

Assistant:

static auto
read( StructureDivision& division,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber ) {

  std::vector< FileVariant > files;
  while ( not division.isMend() ) {

    switch ( division.tail.MF() ) {

      case  1 : { files.emplace_back( file::Type<  1 >( division, begin, end, lineNumber ) ); break; }
      case  2 : { files.emplace_back( file::Type<  2 >( division, begin, end, lineNumber ) ); break; }
      case  3 : { files.emplace_back( file::Type<  3 >( division, begin, end, lineNumber ) ); break; }
      case  4 : { files.emplace_back( file::Type<  4 >( division, begin, end, lineNumber ) ); break; }
      case  5 : { files.emplace_back( file::Type<  5 >( division, begin, end, lineNumber ) ); break; }
      case  6 : { files.emplace_back( file::Type<  6 >( division, begin, end, lineNumber ) ); break; }
      case  7 : { files.emplace_back( file::Type<  7 >( division, begin, end, lineNumber ) ); break; }
      case  8 : { files.emplace_back( file::Type<  8 >( division, begin, end, lineNumber ) ); break; }
      case  9 : { files.emplace_back( file::Type<  9 >( division, begin, end, lineNumber ) ); break; }
      case 10 : { files.emplace_back( file::Type< 10 >( division, begin, end, lineNumber ) ); break; }
      case 12 : { files.emplace_back( file::Type< 12 >( division, begin, end, lineNumber ) ); break; }
      case 13 : { files.emplace_back( file::Type< 13 >( division, begin, end, lineNumber ) ); break; }
      case 14 : { files.emplace_back( file::Type< 14 >( division, begin, end, lineNumber ) ); break; }
      case 15 : { files.emplace_back( file::Type< 15 >( division, begin, end, lineNumber ) ); break; }
      case 23 : { files.emplace_back( file::Type< 23 >( division, begin, end, lineNumber ) ); break; }
      case 26 : { files.emplace_back( file::Type< 26 >( division, begin, end, lineNumber ) ); break; }
      case 27 : { files.emplace_back( file::Type< 27 >( division, begin, end, lineNumber ) ); break; }
      case 28 : { files.emplace_back( file::Type< 28 >( division, begin, end, lineNumber ) ); break; }
      case 30 : { files.emplace_back( file::Type< 30 >( division, begin, end, lineNumber ) ); break; }
      case 31 : { files.emplace_back( file::Type< 31 >( division, begin, end, lineNumber ) ); break; }
      case 32 : { files.emplace_back( file::Type< 32 >( division, begin, end, lineNumber ) ); break; }
      case 33 : { files.emplace_back( file::Type< 33 >( division, begin, end, lineNumber ) ); break; }
      case 34 : { files.emplace_back( file::Type< 34 >( division, begin, end, lineNumber ) ); break; }
      case 35 : { files.emplace_back( file::Type< 35 >( division, begin, end, lineNumber ) ); break; }
      case 40 : { files.emplace_back( file::Type< 40 >( division, begin, end, lineNumber ) ); break; }
      default : {

        int MF = division.tail.MF();
        Log::error( "Found unsupported file MF{} - skipping file", MF );
        throw std::exception();
      }
    }
    division = StructureDivision( begin, end, lineNumber );
  }
  verifyMEND( division, lineNumber );
  return std::move( files );
}